

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O3

void __thiscall LSMTree::put(LSMTree *this,longlong key,string *s)

{
  pointer pcVar1;
  size_t sVar2;
  MemTable *pMVar3;
  long *local_48 [2];
  long local_38 [2];
  
  pMVar3 = this->memory;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,pcVar1,pcVar1 + s->_M_string_length);
  (*(pMVar3->
    super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    )._vptr_Dictionary[1])(pMVar3,key,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  sVar2 = MemTable::size_bytes(this->memory);
  if ((ulong)(long)this->MEMTABLE_LIMIT < sVar2) {
    DiskTable::persistent(this->disk,this->memory,false);
    pMVar3 = (MemTable *)operator_new(0x30);
    MemTable::MemTable(pMVar3);
    this->memory = pMVar3;
  }
  return;
}

Assistant:

void LSMTree::put(long long key, const std::string &s) {
    memory->put(key, s);
    if (memory->size_bytes() > MEMTABLE_LIMIT) {
        disk->persistent(std::move(*memory));
        memory = new MemTable{};
    }
}